

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

aiReturn __thiscall Assimp::Importer::RegisterPPStep(Importer *this,BaseProcess *pImp)

{
  Logger *this_00;
  BaseProcess *local_20;
  BaseProcess *pImp_local;
  Importer *this_local;
  
  local_20 = pImp;
  pImp_local = (BaseProcess *)this;
  if (pImp != (BaseProcess *)0x0) {
    std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
              (&this->pimpl->mPostProcessingSteps,&local_20);
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Registering custom post-processing step");
    return aiReturn_SUCCESS;
  }
  __assert_fail("__null != pImp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/Importer.cpp"
                ,0xcc,"aiReturn Assimp::Importer::RegisterPPStep(BaseProcess *)");
}

Assistant:

aiReturn Importer::RegisterPPStep(BaseProcess* pImp)
{
    ai_assert(NULL != pImp);
    ASSIMP_BEGIN_EXCEPTION_REGION();

        pimpl->mPostProcessingSteps.push_back(pImp);
        ASSIMP_LOG_INFO("Registering custom post-processing step");

    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_SUCCESS;
}